

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::~IdentityGeometryShaderCase
          (IdentityGeometryShaderCase *this)

{
  IdentityGeometryShaderCase *this_local;
  
  ~IdentityGeometryShaderCase(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

IdentityGeometryShaderCase::~IdentityGeometryShaderCase (void)
{
	deinit();
}